

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nfc.cpp
# Opt level: O0

void __thiscall
NfcFilter::process1(NfcFilter *this,span<const_float,_18446744073709551615UL> src,float *dst)

{
  undefined4 uVar1;
  anon_class_24_4_0251967d __unary_op;
  float *__result;
  undefined8 uVar2;
  const_iterator __first;
  long in_RDI;
  anon_class_24_4_0251967d proc_sample;
  float z1;
  float a1;
  float b1;
  float gain;
  undefined4 uStack_3c;
  float local_30;
  undefined4 local_2c;
  undefined4 local_28;
  undefined4 local_24;
  span<const_float,_18446744073709551615UL> local_10;
  
  local_24 = *(undefined4 *)(in_RDI + 4);
  local_28 = *(undefined4 *)(in_RDI + 8);
  uVar2 = *(undefined8 *)(in_RDI + 4);
  uVar1 = *(undefined4 *)(in_RDI + 0xc);
  local_30 = *(float *)(in_RDI + 0x10);
  local_2c = uVar1;
  __first = al::span<const_float,_18446744073709551615UL>::cbegin(&local_10);
  al::span<const_float,_18446744073709551615UL>::cend(&local_10);
  __result = (float *)CONCAT44(uStack_3c,uVar1);
  __unary_op._8_8_ = __result;
  __unary_op._0_8_ = uVar2;
  __unary_op.z1 = &local_30;
  std::
  transform<float_const*,float*,NfcFilter::process1(al::span<float_const,18446744073709551615ul>,float*)::__0>
            (__first,&local_30,__result,__unary_op);
  *(float *)(in_RDI + 0x10) = local_30;
  return;
}

Assistant:

void NfcFilter::process1(const al::span<const float> src, float *RESTRICT dst)
{
    const float gain{first.gain};
    const float b1{first.b1};
    const float a1{first.a1};
    float z1{first.z[0]};
    auto proc_sample = [gain,b1,a1,&z1](const float in) noexcept -> float
    {
        const float y{in*gain - a1*z1};
        const float out{y + b1*z1};
        z1 += y;
        return out;
    };
    std::transform(src.cbegin(), src.cend(), dst, proc_sample);
    first.z[0] = z1;
}